

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O0

void InterpreterThunkEmitter::EncodeInterpreterThunk
               (BYTE *thunkBuffer,intptr_t thunkBufferStartAddress,intptr_t epilogStart,
               DWORD epilogSize,intptr_t interpreterThunk)

{
  BYTE BVar1;
  uint totalThunkSize;
  intptr_t interpreterThunk_local;
  DWORD epilogSize_local;
  intptr_t epilogStart_local;
  intptr_t thunkBufferStartAddress_local;
  BYTE *thunkBuffer_local;
  
  Emit<unsigned_long>(thunkBuffer,0x3d,interpreterThunk);
  BVar1 = Js::FunctionBody::GetOffsetOfDynamicInterpreterThunk();
  thunkBuffer[0xf] = BVar1;
  BVar1 = Js::JavascriptFunction::GetOffsetOfFunctionInfo();
  thunkBuffer[7] = BVar1;
  BVar1 = Js::FunctionInfo::GetOffsetOfFunctionProxy();
  thunkBuffer[0xb] = BVar1;
  Emit<unsigned_long>(thunkBuffer,0x19,thunkBufferStartAddress + 0x48);
  Emit<unsigned_int>(thunkBuffer,0x27,(int)epilogStart - ((int)thunkBufferStartAddress + 0x48));
  Emit<unsigned_char>(thunkBuffer,0x30,'\x05');
  return;
}

Assistant:

void InterpreterThunkEmitter::EncodeInterpreterThunk(
    __in_bcount(InterpreterThunkSize) BYTE* thunkBuffer,
    __in const intptr_t thunkBufferStartAddress,
    __in const intptr_t epilogStart,
    __in const DWORD epilogSize,
    __in const intptr_t interpreterThunk)
{
    Emit(thunkBuffer, ThunkAddressOffset, (uintptr_t)interpreterThunk);
    thunkBuffer[DynamicThunkAddressOffset] = Js::FunctionBody::GetOffsetOfDynamicInterpreterThunk();
    thunkBuffer[FunctionInfoOffset] = Js::JavascriptFunction::GetOffsetOfFunctionInfo();
    thunkBuffer[FunctionProxyOffset] = Js::FunctionInfo::GetOffsetOfFunctionProxy();
    Emit(thunkBuffer, CallBlockStartAddrOffset, (uintptr_t) thunkBufferStartAddress + HeaderSize);
    uint totalThunkSize = (uint)(epilogStart - (thunkBufferStartAddress + HeaderSize));
    Emit(thunkBuffer, ThunkSizeOffset, totalThunkSize);
    Emit(thunkBuffer, ErrorOffset, (BYTE) FAST_FAIL_INVALID_ARG);
}